

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

void xmlCompileStepPattern(xmlPatParserContextPtr ctxt)

{
  xmlDictPtr pxVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  xmlChar *value;
  byte *pbVar5;
  xmlPatternPtr pxVar6;
  xmlChar *value_00;
  xmlChar *pxVar7;
  byte bVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  xmlPatOp xStack_40;
  
  pbVar5 = ctxt->cur;
  while( true ) {
    pbVar4 = pbVar5 + 1;
    uVar9 = (ulong)(*pbVar5 - 9);
    if (0x37 < *pbVar5 - 9) break;
    if ((0x800013UL >> (uVar9 & 0x3f) & 1) == 0) {
      if (uVar9 == 0x25) {
        ctxt->cur = pbVar4;
        pxVar6 = ctxt->comp;
        xStack_40 = XML_OP_ELEM;
        goto LAB_0016ba8e;
      }
      if (uVar9 == 0x37) {
        if ((ctxt->comp->flags & 2) != 0) goto LAB_0016bc4c;
        ctxt->cur = pbVar4;
        goto LAB_0016ba18;
      }
      break;
    }
    ctxt->cur = pbVar4;
    pbVar5 = pbVar4;
  }
  value = xmlPatScanNCName(ctxt);
  if (ctxt->error < 0) {
    return;
  }
  pbVar5 = ctxt->cur;
  bVar8 = *pbVar5;
  if (value == (xmlChar *)0x0) {
LAB_0016bb56:
    if (bVar8 == 0x2a) {
      ctxt->cur = pbVar5 + 1;
      pxVar6 = ctxt->comp;
      xStack_40 = XML_OP_ALL;
LAB_0016ba8e:
      xmlPatternAdd(ctxt,pxVar6,xStack_40,(xmlChar *)0x0,(xmlChar *)0x0);
      return;
    }
LAB_0016bc4c:
    ctxt->error = 1;
    return;
  }
  bVar2 = false;
  if ((bVar8 < 0x21) && (bVar2 = false, (0x100002600U >> ((ulong)(uint)bVar8 & 0x3f) & 1) != 0)) {
    while( true ) {
      pbVar4 = pbVar5 + 1;
      if ((0x20 < bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar4;
      bVar8 = *pbVar4;
      pbVar5 = pbVar4;
    }
    bVar2 = true;
  }
  if (bVar8 == 0x2a) goto LAB_0016bc62;
  if (bVar8 == 0x3a) {
    ctxt->cur = pbVar5 + 1;
    bVar8 = pbVar5[1];
    if (bVar8 == 0x3a) {
      ctxt->cur = pbVar5 + 2;
      iVar3 = xmlStrEqual(value,"child");
      if (iVar3 == 0) {
        iVar3 = xmlStrEqual(value,"attribute");
        if (iVar3 != 0) {
          pxVar6 = ctxt->comp;
          if (pxVar6->dict == (xmlDictPtr)0x0) {
            (*xmlFree)(value);
            pxVar6 = ctxt->comp;
          }
          if ((pxVar6->flags & 2) == 0) {
LAB_0016ba18:
            xmlCompileAttributeTest(ctxt);
            return;
          }
          goto LAB_0016bc4c;
        }
LAB_0016bc62:
        ctxt->error = 1;
        goto LAB_0016bc69;
      }
      if (ctxt->comp->dict == (xmlDictPtr)0x0) {
        (*xmlFree)(value);
      }
      value = xmlPatScanName(ctxt);
      pbVar5 = ctxt->cur;
      bVar8 = *pbVar5;
      if (value == (xmlChar *)0x0) goto LAB_0016bb56;
      if (bVar8 != 0x3a) {
        iVar3 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,value,(xmlChar *)0x0);
        if (iVar3 == 0) {
          return;
        }
        goto LAB_0016bc6e;
      }
      ctxt->cur = pbVar5 + 1;
      if (((ulong)pbVar5[1] < 0x21) && ((0x100002600U >> ((ulong)pbVar5[1] & 0x3f) & 1) != 0)) {
        ctxt->error = 1;
        goto LAB_0016bc6e;
      }
      value_00 = xmlPatScanName(ctxt);
      if (((*value == 'x') && ((value[1] == 'm' && (value[2] == 'l')))) && (value[3] == '\0'))
      goto LAB_0016bdfc;
      pxVar7 = (xmlChar *)0x0;
      lVar10 = 0;
      for (lVar11 = 0; lVar11 < ctxt->nb_namespaces; lVar11 = lVar11 + 1) {
        iVar3 = xmlStrEqual(*(xmlChar **)((long)ctxt->namespaces + lVar10 + 8),value);
        if (iVar3 != 0) goto LAB_0016bd07;
        lVar10 = lVar10 + 0x10;
      }
LAB_0016bd31:
      if ((int)lVar11 < ctxt->nb_namespaces) goto LAB_0016bd37;
LAB_0016bdb0:
      ctxt->error = 1;
    }
    else {
      if ((bVar2 || bVar8 == 0x20) || ((bVar8 < 0xe && ((0x2600U >> (bVar8 & 0x1f) & 1) != 0))))
      goto LAB_0016bc62;
      value_00 = xmlPatScanName(ctxt);
      if ((*value != 'x') || (((value[1] != 'm' || (value[2] != 'l')) || (value[3] != '\0')))) {
        pxVar7 = (xmlChar *)0x0;
        lVar10 = 0;
        for (lVar11 = 0; lVar11 < ctxt->nb_namespaces; lVar11 = lVar11 + 1) {
          iVar3 = xmlStrEqual(*(xmlChar **)((long)ctxt->namespaces + lVar10 + 8),value);
          if (iVar3 != 0) goto LAB_0016bd07;
          lVar10 = lVar10 + 0x10;
        }
        goto LAB_0016bd31;
      }
LAB_0016bdfc:
      pxVar1 = ctxt->comp->dict;
      if (pxVar1 == (xmlDictPtr)0x0) {
        pxVar7 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
      }
      else {
        pxVar7 = xmlDictLookup(pxVar1,(xmlChar *)"http://www.w3.org/XML/1998/namespace",-1);
      }
LAB_0016bd37:
      if (ctxt->comp->dict == (xmlDictPtr)0x0) {
        (*xmlFree)(value);
      }
      if (value_00 == (xmlChar *)0x0) {
        if (*ctxt->cur != '*') {
          value = (xmlChar *)0x0;
          value_00 = (xmlChar *)0x0;
          goto LAB_0016bdb0;
        }
        ctxt->cur = ctxt->cur + 1;
        value = (xmlChar *)0x0;
        iVar3 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_NS,pxVar7,(xmlChar *)0x0);
        value_00 = (xmlChar *)0x0;
        if (iVar3 == 0) {
          return;
        }
      }
      else {
        iVar3 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,value_00,pxVar7);
        if (iVar3 == 0) {
          return;
        }
        value = (xmlChar *)0x0;
      }
    }
    if ((pxVar7 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
      (*xmlFree)(pxVar7);
    }
    if ((value_00 != (xmlChar *)0x0) && (ctxt->comp->dict == (xmlDictPtr)0x0)) {
      (*xmlFree)(value_00);
    }
  }
  else {
    iVar3 = xmlPatternAdd(ctxt,ctxt->comp,XML_OP_ELEM,value,(xmlChar *)0x0);
    if (iVar3 == 0) {
      return;
    }
  }
LAB_0016bc69:
  if (value == (xmlChar *)0x0) {
    return;
  }
LAB_0016bc6e:
  if (ctxt->comp->dict != (xmlDictPtr)0x0) {
    return;
  }
  (*xmlFree)(value);
  return;
LAB_0016bd07:
  pxVar1 = ctxt->comp->dict;
  pxVar7 = *(xmlChar **)((long)ctxt->namespaces + lVar10);
  if (pxVar1 == (xmlDictPtr)0x0) {
    pxVar7 = xmlStrdup(pxVar7);
  }
  else {
    pxVar7 = xmlDictLookup(pxVar1,pxVar7,-1);
  }
  goto LAB_0016bd31;
}

Assistant:

static void
xmlCompileStepPattern(xmlPatParserContextPtr ctxt) {
    xmlChar *token = NULL;
    xmlChar *name = NULL;
    xmlChar *URL = NULL;
    int hasBlanks = 0;

    SKIP_BLANKS;
    if (CUR == '.') {
	/*
	* Context node.
	*/
	NEXT;
	PUSH(XML_OP_ELEM, NULL, NULL);
	return;
    }
    if (CUR == '@') {
	/*
	* Attribute test.
	*/
	if (XML_STREAM_XS_IDC_SEL(ctxt->comp)) {
	    ERROR5(NULL, NULL, NULL,
		"Unexpected attribute axis in '%s'.\n", ctxt->base);
	    ctxt->error = 1;
	    return;
	}
	NEXT;
	xmlCompileAttributeTest(ctxt);
	if (ctxt->error != 0)
	    goto error;
	return;
    }
    name = xmlPatScanNCName(ctxt);
    if (ctxt->error < 0)
        return;
    if (name == NULL) {
	if (CUR == '*') {
	    NEXT;
	    PUSH(XML_OP_ALL, NULL, NULL);
	    return;
	} else {
	    ERROR(NULL, NULL, NULL,
		    "xmlCompileStepPattern : Name expected\n");
	    ctxt->error = 1;
	    return;
	}
    }
    if (IS_BLANK_CH(CUR)) {
	hasBlanks = 1;
	SKIP_BLANKS;
    }
    if (CUR == ':') {
	NEXT;
	if (CUR != ':') {
	    xmlChar *prefix = name;
	    int i;

	    if (hasBlanks || IS_BLANK_CH(CUR)) {
		ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
		ctxt->error = 1;
		goto error;
	    }
	    /*
	     * This is a namespace match
	     */
	    token = xmlPatScanName(ctxt);
	    if ((prefix[0] == 'x') &&
		(prefix[1] == 'm') &&
		(prefix[2] == 'l') &&
		(prefix[3] == 0))
	    {
		XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE)
	    } else {
		for (i = 0;i < ctxt->nb_namespaces;i++) {
		    if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
			XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
			break;
		    }
		}
		if (i >= ctxt->nb_namespaces) {
		    ERROR5(NULL, NULL, NULL,
			"xmlCompileStepPattern : no namespace bound to prefix %s\n",
			prefix);
		    ctxt->error = 1;
		    goto error;
		}
	    }
	    XML_PAT_FREE_STRING(ctxt, prefix);
	    name = NULL;
	    if (token == NULL) {
		if (CUR == '*') {
		    NEXT;
		    PUSH(XML_OP_NS, URL, NULL);
		} else {
		    ERROR(NULL, NULL, NULL,
			    "xmlCompileStepPattern : Name expected\n");
		    ctxt->error = 1;
		    goto error;
		}
	    } else {
		PUSH(XML_OP_ELEM, token, URL);
	    }
	} else {
	    NEXT;
	    if (xmlStrEqual(name, (const xmlChar *) "child")) {
		XML_PAT_FREE_STRING(ctxt, name);
		name = xmlPatScanName(ctxt);
		if (name == NULL) {
		    if (CUR == '*') {
			NEXT;
			PUSH(XML_OP_ALL, NULL, NULL);
			return;
		    } else {
			ERROR(NULL, NULL, NULL,
			    "xmlCompileStepPattern : QName expected\n");
			ctxt->error = 1;
			goto error;
		    }
		}
		if (CUR == ':') {
		    xmlChar *prefix = name;
		    int i;

		    NEXT;
		    if (IS_BLANK_CH(CUR)) {
			ERROR5(NULL, NULL, NULL, "Invalid QName.\n", NULL);
			ctxt->error = 1;
			goto error;
		    }
		    /*
		    * This is a namespace match
		    */
		    token = xmlPatScanName(ctxt);
		    if ((prefix[0] == 'x') &&
			(prefix[1] == 'm') &&
			(prefix[2] == 'l') &&
			(prefix[3] == 0))
		    {
			XML_PAT_COPY_NSNAME(ctxt, URL, XML_XML_NAMESPACE)
		    } else {
			for (i = 0;i < ctxt->nb_namespaces;i++) {
			    if (xmlStrEqual(ctxt->namespaces[2 * i + 1], prefix)) {
				XML_PAT_COPY_NSNAME(ctxt, URL, ctxt->namespaces[2 * i])
				break;
			    }
			}
			if (i >= ctxt->nb_namespaces) {
			    ERROR5(NULL, NULL, NULL,
				"xmlCompileStepPattern : no namespace bound "
				"to prefix %s\n", prefix);
			    ctxt->error = 1;
			    goto error;
			}
		    }
		    XML_PAT_FREE_STRING(ctxt, prefix);
		    name = NULL;
		    if (token == NULL) {
			if (CUR == '*') {
			    NEXT;
			    PUSH(XML_OP_NS, URL, NULL);
			} else {
			    ERROR(NULL, NULL, NULL,
				"xmlCompileStepPattern : Name expected\n");
			    ctxt->error = 1;
			    goto error;
			}
		    } else {
			PUSH(XML_OP_ELEM, token, URL);
		    }
		} else
		    PUSH(XML_OP_ELEM, name, NULL);
		return;
	    } else if (xmlStrEqual(name, (const xmlChar *) "attribute")) {
		XML_PAT_FREE_STRING(ctxt, name)
		name = NULL;
		if (XML_STREAM_XS_IDC_SEL(ctxt->comp)) {
		    ERROR5(NULL, NULL, NULL,
			"Unexpected attribute axis in '%s'.\n", ctxt->base);
		    ctxt->error = 1;
		    goto error;
		}
		xmlCompileAttributeTest(ctxt);
		if (ctxt->error != 0)
		    goto error;
		return;
	    } else {
		ERROR5(NULL, NULL, NULL,
		    "The 'element' or 'attribute' axis is expected.\n", NULL);
		ctxt->error = 1;
		goto error;
	    }
	}
    } else if (CUR == '*') {
        if (name != NULL) {
	    ctxt->error = 1;
	    goto error;
	}
	NEXT;
	PUSH(XML_OP_ALL, token, NULL);
    } else {
	PUSH(XML_OP_ELEM, name, NULL);
    }
    return;
error:
    if (URL != NULL)
	XML_PAT_FREE_STRING(ctxt, URL)
    if (token != NULL)
	XML_PAT_FREE_STRING(ctxt, token)
    if (name != NULL)
	XML_PAT_FREE_STRING(ctxt, name)
}